

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O2

void __thiscall
SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
::SimpleHashTable(SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                  *this,HeapAllocator *allocator)

{
  uint uVar1;
  
  this->allocator = allocator;
  this->count = 0;
  this->freecount = 0;
  this->modFunctionIndex = 0x4b;
  uVar1 = PowerOf2Policy::GetSize(0x40,&this->modFunctionIndex);
  this->size = uVar1;
  Initialize(this);
  return;
}

Assistant:

SimpleHashTable(TAllocator *allocator) :
        allocator(allocator),
        count(0),
        freecount(0),
        modFunctionIndex(UNKNOWN_MOD_INDEX)
    {
        this->size = SizePolicy::GetSize(64, &modFunctionIndex);
        Initialize();
    }